

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-utils.cpp
# Opt level: O0

void __thiscall wasm::ModuleUtils::anon_unknown_4::TypeInfos::note(TypeInfos *this,Type type)

{
  bool bVar1;
  reference pHVar2;
  HeapType ht;
  iterator __end3;
  iterator __begin3;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__range3;
  TypeInfos *this_local;
  Type type_local;
  
  this_local = (TypeInfos *)type.id;
  wasm::Type::getHeapTypeChildren
            ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&__begin3,
             (Type *)&this_local);
  __end3 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::begin
                     ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&__begin3);
  ht.id = (uintptr_t)
          std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::end
                    ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&__begin3);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end3,(__normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
                                *)&ht);
    if (!bVar1) break;
    pHVar2 = __gnu_cxx::
             __normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
             ::operator*(&__end3);
    note(this,(HeapType)pHVar2->id);
    __gnu_cxx::
    __normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
    ::operator++(&__end3);
  }
  std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector
            ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&__begin3);
  return;
}

Assistant:

void note(Type type) {
    for (HeapType ht : type.getHeapTypeChildren()) {
      note(ht);
    }
  }